

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar2;
  BVH *bvh;
  size_t sVar3;
  Ref<embree::Geometry> *pRVar4;
  Geometry *pGVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar41;
  int iVar42;
  int iVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  byte bVar46;
  byte bVar47;
  int iVar48;
  AABBNodeMB4D *node1;
  ulong uVar49;
  byte bVar50;
  byte bVar51;
  ushort uVar52;
  ulong uVar53;
  long lVar54;
  ulong uVar55;
  NodeRef root;
  ulong uVar56;
  ulong uVar57;
  uint uVar58;
  vuint<4> *v;
  long lVar59;
  NodeRef *pNVar60;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar61;
  undefined4 uVar62;
  bool bVar63;
  ulong uVar64;
  ulong uVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar87;
  float fVar90;
  float fVar91;
  undefined1 auVar88 [16];
  float fVar92;
  undefined1 auVar89 [32];
  float fVar93;
  float fVar95;
  float fVar96;
  vint4 ai_2;
  undefined1 auVar94 [16];
  float fVar97;
  float fVar98;
  vint4 ai;
  undefined1 auVar99 [16];
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 in_ZMM2 [64];
  float fVar103;
  float fVar106;
  float fVar107;
  vint4 ai_1;
  undefined1 auVar104 [16];
  float fVar108;
  undefined1 auVar105 [16];
  float fVar109;
  float fVar112;
  float fVar113;
  vint4 ai_3;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar114;
  float fVar115;
  float fVar118;
  float fVar119;
  vint4 bi;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar120;
  float fVar121;
  float fVar124;
  float fVar125;
  vint4 bi_1;
  undefined1 auVar122 [16];
  float fVar126;
  undefined1 auVar123 [16];
  float fVar127;
  float fVar131;
  float fVar132;
  vint4 bi_3;
  undefined1 auVar128 [16];
  float fVar133;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar134;
  float fVar136;
  float fVar137;
  vint4 bi_2;
  float fVar138;
  undefined1 auVar135 [16];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar144 [16];
  uint uVar148;
  float fVar149;
  uint uVar150;
  float fVar151;
  uint uVar152;
  float fVar153;
  uint uVar154;
  float fVar155;
  float fVar156;
  float fVar158;
  float fVar159;
  undefined1 auVar157 [16];
  float fVar160;
  float fVar161;
  undefined1 auVar162 [16];
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar163 [64];
  undefined1 auVar167 [16];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  vuint<4> *v_1;
  Precalculations pre;
  vint<4> itime;
  Vec3<embree::vfloat_impl<4>_> p1;
  Vec3<embree::vfloat_impl<4>_> p0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1878;
  undefined1 local_1868 [16];
  undefined1 local_1858 [16];
  undefined1 local_1848 [16];
  undefined1 local_1838 [16];
  undefined1 local_1818 [8];
  float fStack_1810;
  float fStack_180c;
  TravRayK<4,_false> tray;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar66 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar71 = ZEXT816(0) << 0x40;
    uVar11 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar71,5);
    uVar65 = vpcmpeqd_avx512vl(auVar66,(undefined1  [16])valid_i->field_0);
    uVar65 = ((byte)uVar11 & 0xf) & uVar65;
    bVar47 = (byte)uVar65;
    if (bVar47 != 0) {
      tray.org.field_0._0_4_ = *(float *)ray;
      tray.org.field_0._4_4_ = *(float *)(ray + 4);
      tray.org.field_0._8_4_ = *(float *)(ray + 8);
      tray.org.field_0._12_4_ = *(float *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(float *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(float *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(float *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(float *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(float *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(float *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(float *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(float *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar168 = ZEXT1664(auVar66);
      auVar67 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar66);
      auVar69._8_4_ = 0x219392ef;
      auVar69._0_8_ = 0x219392ef219392ef;
      auVar69._12_4_ = 0x219392ef;
      uVar49 = vcmpps_avx512vl(auVar67,auVar69,1);
      bVar63 = (bool)((byte)uVar49 & 1);
      auVar67._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * tray.dir.field_0._0_4_;
      bVar63 = (bool)((byte)(uVar49 >> 1) & 1);
      auVar67._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * tray.dir.field_0._4_4_;
      bVar63 = (bool)((byte)(uVar49 >> 2) & 1);
      auVar67._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * tray.dir.field_0._8_4_;
      bVar63 = (bool)((byte)(uVar49 >> 3) & 1);
      auVar67._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * tray.dir.field_0._12_4_;
      auVar68 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar66);
      uVar49 = vcmpps_avx512vl(auVar68,auVar69,1);
      bVar63 = (bool)((byte)uVar49 & 1);
      auVar68._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * tray.dir.field_0._16_4_;
      bVar63 = (bool)((byte)(uVar49 >> 1) & 1);
      auVar68._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * tray.dir.field_0._20_4_;
      bVar63 = (bool)((byte)(uVar49 >> 2) & 1);
      auVar68._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * tray.dir.field_0._24_4_;
      bVar63 = (bool)((byte)(uVar49 >> 3) & 1);
      auVar68._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * tray.dir.field_0._28_4_;
      auVar66 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar66);
      uVar49 = vcmpps_avx512vl(auVar66,auVar69,1);
      bVar63 = (bool)((byte)uVar49 & 1);
      auVar66._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * tray.dir.field_0._32_4_;
      bVar63 = (bool)((byte)(uVar49 >> 1) & 1);
      auVar66._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * tray.dir.field_0._36_4_;
      bVar63 = (bool)((byte)(uVar49 >> 2) & 1);
      auVar66._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * tray.dir.field_0._40_4_;
      bVar63 = (bool)((byte)(uVar49 >> 3) & 1);
      auVar66._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * tray.dir.field_0._44_4_;
      auVar69 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar169 = ZEXT1664(auVar69);
      auVar70 = vrcp14ps_avx512vl(auVar67);
      auVar67 = vfnmadd213ps_avx512vl(auVar67,auVar70,auVar69);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar67,auVar70,auVar70)
      ;
      auVar67 = vrcp14ps_avx512vl(auVar68);
      auVar68 = vfnmadd213ps_avx512vl(auVar68,auVar67,auVar69);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar68,auVar67,auVar67)
      ;
      auVar67 = vrcp14ps_avx512vl(auVar66);
      auVar66 = vfnmadd213ps_avx512vl(auVar66,auVar67,auVar69);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar66,auVar67,auVar67)
      ;
      tray.org_rdir.field_0._32_4_ = *(float *)(ray + 0x20) * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = *(float *)(ray + 0x24) * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = *(float *)(ray + 0x28) * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = *(float *)(ray + 0x2c) * tray.rdir.field_0._44_4_;
      tray.org_rdir.field_0._0_4_ = *(float *)ray * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = *(float *)(ray + 4) * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = *(float *)(ray + 8) * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = *(float *)(ray + 0xc) * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = *(float *)(ray + 0x10) * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = *(float *)(ray + 0x14) * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = *(float *)(ray + 0x18) * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = *(float *)(ray + 0x1c) * tray.rdir.field_0._28_4_;
      uVar49 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar71,1);
      auVar66 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar49 & 1) * auVar66._0_4_;
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar49 >> 1) & 1) * auVar66._4_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar49 >> 2) & 1) * auVar66._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar49 >> 3) & 1) * auVar66._12_4_;
      uVar49 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar71,5);
      auVar66 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar63 = (bool)((byte)uVar49 & 1);
      bVar8 = (bool)((byte)(uVar49 >> 1) & 1);
      bVar9 = (bool)((byte)(uVar49 >> 2) & 1);
      bVar10 = (bool)((byte)(uVar49 >> 3) & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar63 * auVar66._0_4_ | (uint)!bVar63 * 0x30;
      tray.nearXYZ.field_0._20_4_ = (uint)bVar8 * auVar66._4_4_ | (uint)!bVar8 * 0x30;
      tray.nearXYZ.field_0._24_4_ = (uint)bVar9 * auVar66._8_4_ | (uint)!bVar9 * 0x30;
      tray.nearXYZ.field_0._28_4_ = (uint)bVar10 * auVar66._12_4_ | (uint)!bVar10 * 0x30;
      uVar49 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar71,5);
      auVar66 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar63 = (bool)((byte)uVar49 & 1);
      bVar8 = (bool)((byte)(uVar49 >> 1) & 1);
      bVar9 = (bool)((byte)(uVar49 >> 2) & 1);
      bVar10 = (bool)((byte)(uVar49 >> 3) & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar63 * auVar66._0_4_ | (uint)!bVar63 * 0x50;
      tray.nearXYZ.field_0._36_4_ = (uint)bVar8 * auVar66._4_4_ | (uint)!bVar8 * 0x50;
      tray.nearXYZ.field_0._40_4_ = (uint)bVar9 * auVar66._8_4_ | (uint)!bVar9 * 0x50;
      tray.nearXYZ.field_0._44_4_ = (uint)bVar10 * auVar66._12_4_ | (uint)!bVar10 * 0x50;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar171 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar66 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar71);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar47 & 1) * auVar66._0_4_ |
           (uint)!(bool)(bVar47 & 1) * stack_near[0].field_0._0_4_;
      bVar63 = (bool)((byte)(uVar65 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar63 * auVar66._4_4_ | (uint)!bVar63 * stack_near[0].field_0._4_4_;
      bVar63 = (bool)((byte)(uVar65 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar63 * auVar66._8_4_ | (uint)!bVar63 * stack_near[0].field_0._8_4_;
      bVar63 = SUB81(uVar65 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar63 * auVar66._12_4_ | (uint)!bVar63 * stack_near[0].field_0._12_4_;
      auVar66 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar170 = ZEXT1664(auVar66);
      auVar71 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar71);
      tray.tfar.field_0.i[0] =
           (uint)(bVar47 & 1) * auVar71._0_4_ | (uint)!(bool)(bVar47 & 1) * auVar66._0_4_;
      bVar63 = (bool)((byte)(uVar65 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar63 * auVar71._4_4_ | (uint)!bVar63 * auVar66._4_4_;
      bVar63 = (bool)((byte)(uVar65 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar63 * auVar71._8_4_ | (uint)!bVar63 * auVar66._8_4_;
      bVar63 = SUB81(uVar65 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar63 * auVar71._12_4_ | (uint)!bVar63 * auVar66._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar58 = 3;
      }
      else {
        uVar58 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      uVar52 = (ushort)uVar65 ^ 0xf;
      pNVar60 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar61 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar66 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
      auVar172 = ZEXT1664(auVar66);
      auVar66 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar173 = ZEXT1664(auVar66);
      do {
        paVar61 = paVar61 + -1;
        root.ptr = pNVar60[-1].ptr;
        pNVar60 = pNVar60 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_00737e8a:
          iVar48 = 3;
        }
        else {
          aVar2 = *paVar61;
          uVar65 = vcmpps_avx512vl((undefined1  [16])aVar2,(undefined1  [16])tray.tfar.field_0,1);
          if ((char)uVar65 == '\0') {
LAB_00737ebf:
            iVar48 = 2;
          }
          else {
            uVar62 = (undefined4)uVar65;
            iVar48 = 0;
            if ((uint)POPCOUNT(uVar62) <= uVar58) {
              do {
                sVar3 = 0;
                for (uVar49 = uVar65; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000)
                {
                  sVar3 = sVar3 + 1;
                }
                bVar63 = occluded1(This,bvh,root,sVar3,&pre,ray,&tray,context);
                bVar50 = (byte)(1 << ((uint)sVar3 & 0x1f));
                if (!bVar63) {
                  bVar50 = 0;
                }
                bVar50 = (byte)uVar52 | bVar50;
                uVar52 = (ushort)bVar50;
                uVar65 = uVar65 - 1 & uVar65;
              } while (uVar65 != 0);
              if (bVar50 == 0xf) {
                iVar48 = 3;
              }
              else {
                auVar66 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                tray.tfar.field_0.i[0] =
                     (uint)(bVar50 & 1) * auVar66._0_4_ |
                     (uint)!(bool)(bVar50 & 1) * tray.tfar.field_0.i[0];
                bVar63 = (bool)(bVar50 >> 1 & 1);
                tray.tfar.field_0.i[1] =
                     (uint)bVar63 * auVar66._4_4_ | (uint)!bVar63 * tray.tfar.field_0.i[1];
                bVar63 = (bool)(bVar50 >> 2 & 1);
                tray.tfar.field_0.i[2] =
                     (uint)bVar63 * auVar66._8_4_ | (uint)!bVar63 * tray.tfar.field_0.i[2];
                bVar63 = (bool)(bVar50 >> 3 & 1);
                tray.tfar.field_0.i[3] =
                     (uint)bVar63 * auVar66._12_4_ | (uint)!bVar63 * tray.tfar.field_0.i[3];
                iVar48 = 2;
              }
              auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar168 = ZEXT1664(auVar66);
              auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar169 = ZEXT1664(auVar66);
              auVar66 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar170 = ZEXT1664(auVar66);
              auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar171 = ZEXT1664(auVar66);
              auVar66 = vxorps_avx512vl(auVar172._0_16_,auVar172._0_16_);
              auVar172 = ZEXT1664(auVar66);
              auVar66 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar173 = ZEXT1664(auVar66);
            }
            auVar163 = ZEXT1664((undefined1  [16])aVar2);
            if (uVar58 < (uint)POPCOUNT(uVar62)) {
              do {
                uVar148 = (uint)root.ptr;
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_00737e8a;
                  uVar11 = vcmpps_avx512vl(auVar163._0_16_,(undefined1  [16])tray.tfar.field_0,9);
                  if ((char)uVar11 != '\0') {
                    uVar65 = (ulong)(uVar148 & 0xf);
                    bVar50 = (byte)uVar52 & 0xf;
                    if (uVar65 != 8) {
                      bVar50 = bVar50 ^ 0xf;
                      uVar49 = 0;
                      do {
                        lVar59 = uVar49 * 0x50 + (root.ptr & 0xfffffffffffffff0);
                        uVar14 = 0;
                        uVar53 = (ulong)bVar50;
                        for (uVar55 = uVar53; (uVar55 & 1) == 0;
                            uVar55 = uVar55 >> 1 | 0x8000000000000000) {
                          uVar14 = uVar14 + 1;
                        }
                        uVar55 = 0;
                        bVar46 = bVar50;
                        while (*(int *)(lVar59 + 0x40 + uVar55 * 4) != -1) {
                          pRVar4 = (context->scene->geometries).items;
                          pGVar5 = pRVar4[*(uint *)(lVar59 + 0x30 + uVar55 * 4)].ptr;
                          fVar87 = (pGVar5->time_range).lower;
                          auVar71._4_4_ = fVar87;
                          auVar71._0_4_ = fVar87;
                          auVar71._8_4_ = fVar87;
                          auVar71._12_4_ = fVar87;
                          fVar90 = pGVar5->fnumTimeSegments;
                          auVar73._4_4_ = fVar90;
                          auVar73._0_4_ = fVar90;
                          auVar73._8_4_ = fVar90;
                          auVar73._12_4_ = fVar90;
                          auVar66 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar71);
                          fVar87 = (pGVar5->time_range).upper - fVar87;
                          auVar70._4_4_ = fVar87;
                          auVar70._0_4_ = fVar87;
                          auVar70._8_4_ = fVar87;
                          auVar70._12_4_ = fVar87;
                          auVar66 = vdivps_avx(auVar66,auVar70);
                          auVar72._0_4_ = fVar90 * auVar66._0_4_;
                          auVar72._4_4_ = fVar90 * auVar66._4_4_;
                          auVar72._8_4_ = fVar90 * auVar66._8_4_;
                          auVar72._12_4_ = fVar90 * auVar66._12_4_;
                          auVar66 = vroundps_avx(auVar72,1);
                          auVar71 = vaddss_avx512f(auVar73,SUB6416(ZEXT464(0xbf800000),0));
                          auVar74._0_4_ = auVar71._0_4_;
                          auVar74._4_4_ = auVar74._0_4_;
                          auVar74._8_4_ = auVar74._0_4_;
                          auVar74._12_4_ = auVar74._0_4_;
                          auVar66 = vminps_avx(auVar66,auVar74);
                          auVar67 = auVar172._0_16_;
                          auVar66 = vmaxps_avx512vl(auVar66,auVar67);
                          itime.field_0 =
                               (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar66);
                          auVar66 = vsubps_avx(auVar72,auVar66);
                          auVar71 = vpbroadcastd_avx512vl();
                          uVar11 = vpcmpeqd_avx512vl(auVar71,(undefined1  [16])itime.field_0);
                          auVar71 = auVar169._0_16_;
                          if (((byte)uVar11 & 0xf | ~bVar50 & 0xf) == 0xf) {
                            lVar54 = (long)itime.field_0.i[uVar14] * 0x38;
                            lVar6 = *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar54);
                            lVar54 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar54);
                            uVar57 = (ulong)*(uint *)(lVar59 + uVar55 * 4);
                            uVar64 = (ulong)*(uint *)(lVar59 + 0x10 + uVar55 * 4);
                            auVar68 = vsubps_avx512vl(auVar71,auVar66);
                            uVar62 = *(undefined4 *)(lVar54 + uVar57 * 4);
                            auVar84._4_4_ = uVar62;
                            auVar84._0_4_ = uVar62;
                            auVar84._8_4_ = uVar62;
                            auVar84._12_4_ = uVar62;
                            auVar69 = vmulps_avx512vl(auVar66,auVar84);
                            uVar62 = *(undefined4 *)(lVar54 + 4 + uVar57 * 4);
                            auVar24._4_4_ = uVar62;
                            auVar24._0_4_ = uVar62;
                            auVar24._8_4_ = uVar62;
                            auVar24._12_4_ = uVar62;
                            auVar70 = vmulps_avx512vl(auVar66,auVar24);
                            uVar62 = *(undefined4 *)(lVar54 + 8 + uVar57 * 4);
                            auVar25._4_4_ = uVar62;
                            auVar25._0_4_ = uVar62;
                            auVar25._8_4_ = uVar62;
                            auVar25._12_4_ = uVar62;
                            auVar72 = vmulps_avx512vl(auVar66,auVar25);
                            uVar62 = *(undefined4 *)(lVar6 + uVar57 * 4);
                            auVar26._4_4_ = uVar62;
                            auVar26._0_4_ = uVar62;
                            auVar26._8_4_ = uVar62;
                            auVar26._12_4_ = uVar62;
                            auVar75 = vfmadd231ps_avx512vl(auVar69,auVar68,auVar26);
                            uVar62 = *(undefined4 *)(lVar6 + 4 + uVar57 * 4);
                            auVar27._4_4_ = uVar62;
                            auVar27._0_4_ = uVar62;
                            auVar27._8_4_ = uVar62;
                            auVar27._12_4_ = uVar62;
                            auVar76 = vfmadd231ps_avx512vl(auVar70,auVar68,auVar27);
                            uVar62 = *(undefined4 *)(lVar6 + 8 + uVar57 * 4);
                            auVar28._4_4_ = uVar62;
                            auVar28._0_4_ = uVar62;
                            auVar28._8_4_ = uVar62;
                            auVar28._12_4_ = uVar62;
                            auVar77 = vfmadd231ps_avx512vl(auVar72,auVar68,auVar28);
                            uVar62 = *(undefined4 *)(lVar54 + uVar64 * 4);
                            auVar29._4_4_ = uVar62;
                            auVar29._0_4_ = uVar62;
                            auVar29._8_4_ = uVar62;
                            auVar29._12_4_ = uVar62;
                            auVar69 = vmulps_avx512vl(auVar66,auVar29);
                            uVar62 = *(undefined4 *)(lVar54 + 4 + uVar64 * 4);
                            auVar30._4_4_ = uVar62;
                            auVar30._0_4_ = uVar62;
                            auVar30._8_4_ = uVar62;
                            auVar30._12_4_ = uVar62;
                            auVar70 = vmulps_avx512vl(auVar66,auVar30);
                            uVar62 = *(undefined4 *)(lVar54 + 8 + uVar64 * 4);
                            auVar31._4_4_ = uVar62;
                            auVar31._0_4_ = uVar62;
                            auVar31._8_4_ = uVar62;
                            auVar31._12_4_ = uVar62;
                            auVar72 = vmulps_avx512vl(auVar66,auVar31);
                            uVar62 = *(undefined4 *)(lVar6 + uVar64 * 4);
                            auVar32._4_4_ = uVar62;
                            auVar32._0_4_ = uVar62;
                            auVar32._8_4_ = uVar62;
                            auVar32._12_4_ = uVar62;
                            auVar78 = vfmadd231ps_avx512vl(auVar69,auVar68,auVar32);
                            uVar62 = *(undefined4 *)(lVar6 + 4 + uVar64 * 4);
                            auVar33._4_4_ = uVar62;
                            auVar33._0_4_ = uVar62;
                            auVar33._8_4_ = uVar62;
                            auVar33._12_4_ = uVar62;
                            auVar79 = vfmadd231ps_avx512vl(auVar70,auVar68,auVar33);
                            uVar62 = *(undefined4 *)(lVar6 + 8 + uVar64 * 4);
                            auVar34._4_4_ = uVar62;
                            auVar34._0_4_ = uVar62;
                            auVar34._8_4_ = uVar62;
                            auVar34._12_4_ = uVar62;
                            auVar80 = vfmadd231ps_avx512vl(auVar72,auVar68,auVar34);
                            uVar64 = (ulong)*(uint *)(lVar59 + 0x20 + uVar55 * 4);
                            uVar62 = *(undefined4 *)(lVar54 + uVar64 * 4);
                            auVar35._4_4_ = uVar62;
                            auVar35._0_4_ = uVar62;
                            auVar35._8_4_ = uVar62;
                            auVar35._12_4_ = uVar62;
                            auVar69 = vmulps_avx512vl(auVar66,auVar35);
                            uVar62 = *(undefined4 *)(lVar54 + 4 + uVar64 * 4);
                            auVar36._4_4_ = uVar62;
                            auVar36._0_4_ = uVar62;
                            auVar36._8_4_ = uVar62;
                            auVar36._12_4_ = uVar62;
                            auVar70 = vmulps_avx512vl(auVar66,auVar36);
                            uVar62 = *(undefined4 *)(lVar54 + 8 + uVar64 * 4);
                            auVar37._4_4_ = uVar62;
                            auVar37._0_4_ = uVar62;
                            auVar37._8_4_ = uVar62;
                            auVar37._12_4_ = uVar62;
                            auVar66 = vmulps_avx512vl(auVar66,auVar37);
                            uVar62 = *(undefined4 *)(lVar6 + uVar64 * 4);
                            auVar38._4_4_ = uVar62;
                            auVar38._0_4_ = uVar62;
                            auVar38._8_4_ = uVar62;
                            auVar38._12_4_ = uVar62;
                            auVar81 = vfmadd231ps_avx512vl(auVar69,auVar68,auVar38);
                            uVar62 = *(undefined4 *)(lVar6 + 4 + uVar64 * 4);
                            auVar39._4_4_ = uVar62;
                            auVar39._0_4_ = uVar62;
                            auVar39._8_4_ = uVar62;
                            auVar39._12_4_ = uVar62;
                            auVar82 = vfmadd231ps_avx512vl(auVar70,auVar68,auVar39);
                            uVar62 = *(undefined4 *)(lVar6 + 8 + uVar64 * 4);
                            auVar40._4_4_ = uVar62;
                            auVar40._0_4_ = uVar62;
                            auVar40._8_4_ = uVar62;
                            auVar40._12_4_ = uVar62;
                            auVar83 = vfmadd231ps_avx512vl(auVar66,auVar68,auVar40);
                          }
                          else {
                            if (bVar50 != 0) {
                              lVar6 = *(long *)&pGVar5[2].numPrimitives;
                              uVar56 = (ulong)*(uint *)(lVar59 + uVar55 * 4);
                              uVar57 = uVar53;
                              uVar64 = uVar14;
                              do {
                                lVar54 = (long)itime.field_0.i[uVar64] * 0x38;
                                auVar68 = *(undefined1 (*) [16])
                                           (*(long *)(lVar6 + lVar54) + uVar56 * 4);
                                auVar69 = *(undefined1 (*) [16])
                                           (*(long *)(lVar6 + 0x38 + lVar54) + uVar56 * 4);
                                *(int *)((long)&p0.field_0 + uVar64 * 4) = auVar68._0_4_;
                                uVar62 = vextractps_avx(auVar68,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar64 * 4 + 0x10) = uVar62;
                                uVar62 = vextractps_avx(auVar68,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar64 * 4 + 0x20) = uVar62;
                                *(int *)((long)&p1.field_0 + uVar64 * 4) = auVar69._0_4_;
                                uVar62 = vextractps_avx(auVar69,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar64 * 4 + 0x10) = uVar62;
                                uVar62 = vextractps_avx(auVar69,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar64 * 4 + 0x20) = uVar62;
                                uVar57 = uVar57 ^ 1L << (uVar64 & 0x3f);
                                uVar64 = 0;
                                for (uVar15 = uVar57; (uVar15 & 1) == 0;
                                    uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                                  uVar64 = uVar64 + 1;
                                }
                              } while (uVar57 != 0);
                            }
                            auVar68 = vsubps_avx512vl(auVar71,auVar66);
                            fVar93 = auVar68._0_4_;
                            fVar98 = fVar93 * (float)p0.field_0._0_4_;
                            fVar95 = auVar68._4_4_;
                            fVar100 = fVar95 * (float)p0.field_0._4_4_;
                            fVar96 = auVar68._8_4_;
                            fVar101 = fVar96 * (float)p0.field_0._8_4_;
                            fVar97 = auVar68._12_4_;
                            fVar102 = fVar97 * (float)p0.field_0._12_4_;
                            fVar109 = fVar93 * (float)p0.field_0._16_4_;
                            fVar112 = fVar95 * (float)p0.field_0._20_4_;
                            fVar113 = fVar96 * (float)p0.field_0._24_4_;
                            fVar114 = fVar97 * (float)p0.field_0._28_4_;
                            fVar115 = fVar93 * (float)p0.field_0._32_4_;
                            fVar118 = fVar95 * (float)p0.field_0._36_4_;
                            fVar119 = fVar96 * (float)p0.field_0._40_4_;
                            fVar120 = fVar97 * (float)p0.field_0._44_4_;
                            fVar87 = auVar66._0_4_;
                            fVar103 = fVar87 * (float)p1.field_0._0_4_;
                            fVar90 = auVar66._4_4_;
                            fVar106 = fVar90 * (float)p1.field_0._4_4_;
                            fVar91 = auVar66._8_4_;
                            fVar107 = fVar91 * (float)p1.field_0._8_4_;
                            fVar92 = auVar66._12_4_;
                            fVar108 = fVar92 * (float)p1.field_0._12_4_;
                            fVar121 = fVar87 * (float)p1.field_0._16_4_;
                            fVar124 = fVar90 * (float)p1.field_0._20_4_;
                            fVar125 = fVar91 * (float)p1.field_0._24_4_;
                            fVar126 = fVar92 * (float)p1.field_0._28_4_;
                            fVar127 = fVar87 * (float)p1.field_0._32_4_;
                            fVar131 = fVar90 * (float)p1.field_0._36_4_;
                            fVar132 = fVar91 * (float)p1.field_0._40_4_;
                            fVar133 = fVar92 * (float)p1.field_0._44_4_;
                            if (bVar50 != 0) {
                              lVar6 = *(long *)&pGVar5[2].numPrimitives;
                              uVar56 = (ulong)*(uint *)(lVar59 + 0x10 + uVar55 * 4);
                              uVar57 = uVar53;
                              uVar64 = uVar14;
                              do {
                                lVar54 = (long)itime.field_0.i[uVar64] * 0x38;
                                auVar66 = *(undefined1 (*) [16])
                                           (*(long *)(lVar6 + lVar54) + uVar56 * 4);
                                auVar68 = *(undefined1 (*) [16])
                                           (*(long *)(lVar6 + 0x38 + lVar54) + uVar56 * 4);
                                *(int *)((long)&p0.field_0 + uVar64 * 4) = auVar66._0_4_;
                                uVar62 = vextractps_avx(auVar66,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar64 * 4 + 0x10) = uVar62;
                                uVar62 = vextractps_avx(auVar66,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar64 * 4 + 0x20) = uVar62;
                                *(int *)((long)&p1.field_0 + uVar64 * 4) = auVar68._0_4_;
                                uVar62 = vextractps_avx(auVar68,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar64 * 4 + 0x10) = uVar62;
                                uVar62 = vextractps_avx(auVar68,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar64 * 4 + 0x20) = uVar62;
                                uVar57 = uVar57 ^ 1L << (uVar64 & 0x3f);
                                uVar64 = 0;
                                for (uVar15 = uVar57; (uVar15 & 1) == 0;
                                    uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                                  uVar64 = uVar64 + 1;
                                }
                              } while (uVar57 != 0);
                            }
                            fVar139 = fVar93 * (float)p0.field_0._0_4_;
                            fVar140 = fVar95 * (float)p0.field_0._4_4_;
                            fVar141 = fVar96 * (float)p0.field_0._8_4_;
                            fVar142 = fVar97 * (float)p0.field_0._12_4_;
                            fVar143 = fVar93 * (float)p0.field_0._16_4_;
                            fVar145 = fVar95 * (float)p0.field_0._20_4_;
                            fVar146 = fVar96 * (float)p0.field_0._24_4_;
                            fVar147 = fVar97 * (float)p0.field_0._28_4_;
                            fVar134 = fVar93 * (float)p0.field_0._32_4_;
                            fVar136 = fVar95 * (float)p0.field_0._36_4_;
                            fVar137 = fVar96 * (float)p0.field_0._40_4_;
                            fVar138 = fVar97 * (float)p0.field_0._44_4_;
                            fVar156 = fVar87 * (float)p1.field_0._0_4_;
                            fVar158 = fVar90 * (float)p1.field_0._4_4_;
                            fVar159 = fVar91 * (float)p1.field_0._8_4_;
                            fVar160 = fVar92 * (float)p1.field_0._12_4_;
                            fVar161 = fVar87 * (float)p1.field_0._16_4_;
                            fVar164 = fVar90 * (float)p1.field_0._20_4_;
                            fVar165 = fVar91 * (float)p1.field_0._24_4_;
                            fVar166 = fVar92 * (float)p1.field_0._28_4_;
                            fVar149 = fVar87 * (float)p1.field_0._32_4_;
                            fVar151 = fVar90 * (float)p1.field_0._36_4_;
                            fVar153 = fVar91 * (float)p1.field_0._40_4_;
                            fVar155 = fVar92 * (float)p1.field_0._44_4_;
                            if (bVar50 != 0) {
                              lVar6 = *(long *)&pGVar5[2].numPrimitives;
                              uVar56 = (ulong)*(uint *)(lVar59 + 0x20 + uVar55 * 4);
                              uVar57 = uVar53;
                              uVar64 = uVar14;
                              do {
                                lVar54 = (long)itime.field_0.i[uVar64] * 0x38;
                                auVar66 = *(undefined1 (*) [16])
                                           (*(long *)(lVar6 + lVar54) + uVar56 * 4);
                                auVar68 = *(undefined1 (*) [16])
                                           (*(long *)(lVar6 + 0x38 + lVar54) + uVar56 * 4);
                                *(int *)((long)&p0.field_0 + uVar64 * 4) = auVar66._0_4_;
                                uVar62 = vextractps_avx(auVar66,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar64 * 4 + 0x10) = uVar62;
                                uVar62 = vextractps_avx(auVar66,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar64 * 4 + 0x20) = uVar62;
                                *(int *)((long)&p1.field_0 + uVar64 * 4) = auVar68._0_4_;
                                uVar62 = vextractps_avx(auVar68,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar64 * 4 + 0x10) = uVar62;
                                uVar62 = vextractps_avx(auVar68,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar64 * 4 + 0x20) = uVar62;
                                uVar57 = uVar57 ^ 1L << (uVar64 & 0x3f);
                                uVar64 = 0;
                                for (uVar15 = uVar57; (uVar15 & 1) == 0;
                                    uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                                  uVar64 = uVar64 + 1;
                                }
                              } while (uVar57 != 0);
                            }
                            auVar75._0_4_ = fVar98 + fVar103;
                            auVar75._4_4_ = fVar100 + fVar106;
                            auVar75._8_4_ = fVar101 + fVar107;
                            auVar75._12_4_ = fVar102 + fVar108;
                            auVar76._0_4_ = fVar109 + fVar121;
                            auVar76._4_4_ = fVar112 + fVar124;
                            auVar76._8_4_ = fVar113 + fVar125;
                            auVar76._12_4_ = fVar114 + fVar126;
                            auVar77._0_4_ = fVar115 + fVar127;
                            auVar77._4_4_ = fVar118 + fVar131;
                            auVar77._8_4_ = fVar119 + fVar132;
                            auVar77._12_4_ = fVar120 + fVar133;
                            auVar78._0_4_ = fVar139 + fVar156;
                            auVar78._4_4_ = fVar140 + fVar158;
                            auVar78._8_4_ = fVar141 + fVar159;
                            auVar78._12_4_ = fVar142 + fVar160;
                            auVar79._0_4_ = fVar143 + fVar161;
                            auVar79._4_4_ = fVar145 + fVar164;
                            auVar79._8_4_ = fVar146 + fVar165;
                            auVar79._12_4_ = fVar147 + fVar166;
                            auVar80._0_4_ = fVar134 + fVar149;
                            auVar80._4_4_ = fVar136 + fVar151;
                            auVar80._8_4_ = fVar137 + fVar153;
                            auVar80._12_4_ = fVar138 + fVar155;
                            auVar81._0_4_ =
                                 fVar93 * (float)p0.field_0._0_4_ + fVar87 * (float)p1.field_0._0_4_
                            ;
                            auVar81._4_4_ =
                                 fVar95 * (float)p0.field_0._4_4_ + fVar90 * (float)p1.field_0._4_4_
                            ;
                            auVar81._8_4_ =
                                 fVar96 * (float)p0.field_0._8_4_ + fVar91 * (float)p1.field_0._8_4_
                            ;
                            auVar81._12_4_ =
                                 fVar97 * (float)p0.field_0._12_4_ +
                                 fVar92 * (float)p1.field_0._12_4_;
                            auVar82._0_4_ =
                                 fVar93 * (float)p0.field_0._16_4_ +
                                 fVar87 * (float)p1.field_0._16_4_;
                            auVar82._4_4_ =
                                 fVar95 * (float)p0.field_0._20_4_ +
                                 fVar90 * (float)p1.field_0._20_4_;
                            auVar82._8_4_ =
                                 fVar96 * (float)p0.field_0._24_4_ +
                                 fVar91 * (float)p1.field_0._24_4_;
                            auVar82._12_4_ =
                                 fVar97 * (float)p0.field_0._28_4_ +
                                 fVar92 * (float)p1.field_0._28_4_;
                            auVar83._0_4_ =
                                 fVar93 * (float)p0.field_0._32_4_ +
                                 fVar87 * (float)p1.field_0._32_4_;
                            auVar83._4_4_ =
                                 fVar95 * (float)p0.field_0._36_4_ +
                                 fVar90 * (float)p1.field_0._36_4_;
                            auVar83._8_4_ =
                                 fVar96 * (float)p0.field_0._40_4_ +
                                 fVar91 * (float)p1.field_0._40_4_;
                            auVar83._12_4_ =
                                 fVar97 * (float)p0.field_0._44_4_ +
                                 fVar92 * (float)p1.field_0._44_4_;
                          }
                          local_16e8 = *(undefined8 *)(lVar59 + 0x30);
                          uStack_16e0 = *(undefined8 *)(lVar59 + 0x38);
                          auVar70 = vsubps_avx(auVar75,auVar78);
                          auVar72 = vsubps_avx(auVar76,auVar79);
                          auVar73 = vsubps_avx(auVar77,auVar80);
                          auVar74 = vsubps_avx(auVar81,auVar75);
                          auVar79 = vsubps_avx512vl(auVar82,auVar76);
                          auVar80 = vsubps_avx512vl(auVar83,auVar77);
                          auVar66 = vmulps_avx512vl(auVar72,auVar80);
                          auVar82 = vfmsub231ps_avx512vl(auVar66,auVar79,auVar73);
                          auVar94._0_4_ = auVar73._0_4_ * auVar74._0_4_;
                          auVar94._4_4_ = auVar73._4_4_ * auVar74._4_4_;
                          auVar94._8_4_ = auVar73._8_4_ * auVar74._8_4_;
                          auVar94._12_4_ = auVar73._12_4_ * auVar74._12_4_;
                          auVar84 = vfmsub231ps_avx512vl(auVar94,auVar80,auVar70);
                          auVar66 = vmulps_avx512vl(auVar70,auVar79);
                          aVar2 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                                  vfmsub231ps_fma(auVar66,auVar74,auVar72);
                          auVar83 = vsubps_avx(auVar75,*(undefined1 (*) [16])ray);
                          auVar81 = vsubps_avx(auVar76,*(undefined1 (*) [16])(ray + 0x10));
                          auVar78 = vsubps_avx(auVar77,*(undefined1 (*) [16])(ray + 0x20));
                          auVar66 = *(undefined1 (*) [16])(ray + 0x40);
                          auVar68 = *(undefined1 (*) [16])(ray + 0x50);
                          auVar69 = *(undefined1 (*) [16])(ray + 0x60);
                          auVar157._0_4_ = auVar68._0_4_ * auVar78._0_4_;
                          auVar157._4_4_ = auVar68._4_4_ * auVar78._4_4_;
                          auVar157._8_4_ = auVar68._8_4_ * auVar78._8_4_;
                          auVar157._12_4_ = auVar68._12_4_ * auVar78._12_4_;
                          auVar75 = vfmsub231ps_fma(auVar157,auVar81,auVar69);
                          auVar162._0_4_ = auVar69._0_4_ * auVar83._0_4_;
                          auVar162._4_4_ = auVar69._4_4_ * auVar83._4_4_;
                          auVar162._8_4_ = auVar69._8_4_ * auVar83._8_4_;
                          auVar162._12_4_ = auVar69._12_4_ * auVar83._12_4_;
                          auVar76 = vfmsub231ps_fma(auVar162,auVar78,auVar66);
                          auVar167._0_4_ = auVar66._0_4_ * auVar81._0_4_;
                          auVar167._4_4_ = auVar66._4_4_ * auVar81._4_4_;
                          auVar167._8_4_ = auVar66._8_4_ * auVar81._8_4_;
                          auVar167._12_4_ = auVar66._12_4_ * auVar81._12_4_;
                          auVar77 = vfmsub231ps_fma(auVar167,auVar83,auVar68);
                          auVar117._0_4_ = aVar2.v[0] * auVar69._0_4_;
                          auVar117._4_4_ = aVar2.v[1] * auVar69._4_4_;
                          auVar117._8_4_ = aVar2.v[2] * auVar69._8_4_;
                          auVar117._12_4_ = aVar2.v[3] * auVar69._12_4_;
                          auVar68 = vfmadd231ps_fma(auVar117,auVar84,auVar68);
                          auVar66 = vfmadd231ps_fma(auVar68,auVar82,auVar66);
                          auVar69 = vandps_avx512vl(auVar66,auVar173._0_16_);
                          auVar68 = vmulps_avx512vl(auVar80,auVar77);
                          auVar68 = vfmadd231ps_avx512vl(auVar68,auVar76,auVar79);
                          auVar68 = vfmadd231ps_fma(auVar68,auVar75,auVar74);
                          uVar148 = auVar69._0_4_;
                          auVar111._0_4_ = uVar148 ^ auVar68._0_4_;
                          uVar150 = auVar69._4_4_;
                          auVar111._4_4_ = uVar150 ^ auVar68._4_4_;
                          uVar152 = auVar69._8_4_;
                          auVar111._8_4_ = uVar152 ^ auVar68._8_4_;
                          uVar154 = auVar69._12_4_;
                          auVar111._12_4_ = uVar154 ^ auVar68._12_4_;
                          uVar11 = vcmpps_avx512vl(auVar111,auVar67,5);
                          bVar51 = (byte)uVar11 & bVar46;
                          if (bVar51 == 0) {
LAB_007377c2:
                            bVar51 = 0;
                          }
                          else {
                            auVar144._0_4_ = auVar73._0_4_ * auVar77._0_4_;
                            auVar144._4_4_ = auVar73._4_4_ * auVar77._4_4_;
                            auVar144._8_4_ = auVar73._8_4_ * auVar77._8_4_;
                            auVar144._12_4_ = auVar73._12_4_ * auVar77._12_4_;
                            auVar68 = vfmadd213ps_fma(auVar76,auVar72,auVar144);
                            auVar68 = vfmadd213ps_fma(auVar75,auVar70,auVar68);
                            auVar135._0_4_ = uVar148 ^ auVar68._0_4_;
                            auVar135._4_4_ = uVar150 ^ auVar68._4_4_;
                            auVar135._8_4_ = uVar152 ^ auVar68._8_4_;
                            auVar135._12_4_ = uVar154 ^ auVar68._12_4_;
                            uVar11 = vcmpps_avx512vl(auVar135,auVar67,5);
                            bVar51 = bVar51 & (byte)uVar11;
                            if (bVar51 == 0) goto LAB_007377c2;
                            auVar69 = vandps_avx512vl(auVar66,auVar168._0_16_);
                            auVar68 = vsubps_avx(auVar69,auVar111);
                            uVar11 = vcmpps_avx512vl(auVar68,auVar135,5);
                            bVar51 = bVar51 & (byte)uVar11;
                            if (bVar51 == 0) {
LAB_00737d89:
                              bVar51 = 0;
                            }
                            else {
                              auVar129._0_4_ = aVar2.v[0] * auVar78._0_4_;
                              auVar129._4_4_ = aVar2.v[1] * auVar78._4_4_;
                              auVar129._8_4_ = aVar2.v[2] * auVar78._8_4_;
                              auVar129._12_4_ = aVar2.v[3] * auVar78._12_4_;
                              auVar68 = vfmadd213ps_fma(auVar81,auVar84,auVar129);
                              auVar68 = vfmadd213ps_fma(auVar83,auVar82,auVar68);
                              auVar123._0_4_ = auVar69._0_4_ * *(float *)(ray + 0x30);
                              auVar123._4_4_ = auVar69._4_4_ * *(float *)(ray + 0x34);
                              auVar123._8_4_ = auVar69._8_4_ * *(float *)(ray + 0x38);
                              auVar123._12_4_ = auVar69._12_4_ * *(float *)(ray + 0x3c);
                              auVar105._0_4_ = uVar148 ^ auVar68._0_4_;
                              auVar105._4_4_ = uVar150 ^ auVar68._4_4_;
                              auVar105._8_4_ = uVar152 ^ auVar68._8_4_;
                              auVar105._12_4_ = uVar154 ^ auVar68._12_4_;
                              auVar130._0_4_ = auVar69._0_4_ * *(float *)(ray + 0x80);
                              auVar130._4_4_ = auVar69._4_4_ * *(float *)(ray + 0x84);
                              auVar130._8_4_ = auVar69._8_4_ * *(float *)(ray + 0x88);
                              auVar130._12_4_ = auVar69._12_4_ * *(float *)(ray + 0x8c);
                              uVar11 = vcmpps_avx512vl(auVar105,auVar130,2);
                              uVar12 = vcmpps_avx512vl(auVar123,auVar105,1);
                              bVar51 = bVar51 & (byte)uVar11 & (byte)uVar12;
                              if (bVar51 == 0) goto LAB_00737d89;
                              uVar11 = vcmpps_avx512vl(auVar66,ZEXT816(0) << 0x20,4);
                              bVar51 = bVar51 & (byte)uVar11;
                              if (bVar51 != 0) {
                                local_1878 = aVar2;
                                local_1868 = auVar84;
                                local_1858 = auVar82;
                                local_1848 = auVar69;
                                local_1838 = auVar105;
                                _local_1818 = auVar111;
                              }
                            }
                            auVar168 = ZEXT1664(auVar168._0_16_);
                            auVar66 = vxorps_avx512vl(auVar67,auVar67);
                            auVar172 = ZEXT1664(auVar66);
                          }
                          auVar66 = auVar172._0_16_;
                          pGVar5 = pRVar4[*(uint *)((long)&local_16e8 + uVar55 * 4)].ptr;
                          uVar148 = pGVar5->mask;
                          auVar88._4_4_ = uVar148;
                          auVar88._0_4_ = uVar148;
                          auVar88._8_4_ = uVar148;
                          auVar88._12_4_ = uVar148;
                          uVar11 = vptestmd_avx512vl(auVar88,*(undefined1 (*) [16])(ray + 0x90));
                          bVar51 = (byte)uVar11 & 0xf & bVar51;
                          if (bVar51 != 0) {
                            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                               (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar67 = vrcp14ps_avx512vl(local_1848);
                              auVar71 = vfnmadd213ps_avx512vl(auVar67,local_1848,auVar71);
                              auVar71 = vfmadd132ps_fma(auVar71,auVar67,auVar67);
                              vpbroadcastd_avx512vl();
                              vpbroadcastd_avx512vl();
                              p0.field_0._0_8_ = local_1858._0_8_;
                              p0.field_0._8_8_ = local_1858._8_8_;
                              p0.field_0._16_8_ = local_1868._0_8_;
                              p0.field_0._24_8_ = local_1868._8_8_;
                              p0.field_0.field_0.z.field_0 =
                                   (vfloat_impl<4>)(vfloat_impl<4>)local_1878;
                              auVar89 = ZEXT1632(CONCAT412(auVar71._12_4_ * fStack_180c,
                                                           CONCAT48(auVar71._8_4_ * fStack_1810,
                                                                    CONCAT44(auVar71._4_4_ *
                                                                             (float)local_1818._4_4_
                                                                             ,auVar71._0_4_ *
                                                                              (float)local_1818.
                                                                                     _0_4_))));
                              vpcmpeqd_avx2(auVar89,auVar89);
                              iVar48 = *(int *)(ray + 0x80);
                              iVar41 = *(int *)(ray + 0x84);
                              iVar42 = *(int *)(ray + 0x88);
                              iVar43 = *(int *)(ray + 0x8c);
                              auVar71 = vmulps_avx512vl(auVar71,local_1838);
                              bVar63 = (bool)(bVar51 >> 1 & 1);
                              bVar8 = (bool)(bVar51 >> 2 & 1);
                              *(uint *)(ray + 0x80) =
                                   (uint)(bVar51 & 1) * auVar71._0_4_ |
                                   (uint)!(bool)(bVar51 & 1) * iVar48;
                              *(uint *)(ray + 0x84) =
                                   (uint)bVar63 * auVar71._4_4_ | (uint)!bVar63 * iVar41;
                              *(uint *)(ray + 0x88) =
                                   (uint)bVar8 * auVar71._8_4_ | (uint)!bVar8 * iVar42;
                              *(uint *)(ray + 0x8c) =
                                   (uint)(bVar51 >> 3) * auVar71._12_4_ |
                                   (uint)!(bool)(bVar51 >> 3) * iVar43;
                              itime.field_0 =
                                   (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                   vpmovm2d_avx512vl((ulong)bVar51);
                              p1.field_0._0_8_ = &itime;
                              p1.field_0._8_8_ = pGVar5->userPtr;
                              p1.field_0._16_8_ = context->user;
                              p1.field_0._24_8_ = ray;
                              p1.field_0._32_8_ = &p0;
                              p1.field_0._40_4_ = 4;
                              if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar5->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
                                auVar71 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar173 = ZEXT1664(auVar71);
                                auVar66 = vxorps_avx512vl(auVar66,auVar66);
                                auVar172 = ZEXT1664(auVar66);
                                auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                auVar171 = ZEXT1664(auVar66);
                                auVar66 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                auVar170 = ZEXT1664(auVar66);
                                auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar169 = ZEXT1664(auVar66);
                                auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar168 = ZEXT1664(auVar66);
                              }
                              auVar66 = auVar172._0_16_;
                              uVar64 = vptestmd_avx512vl((undefined1  [16])itime.field_0,
                                                         (undefined1  [16])itime.field_0);
                              uVar64 = uVar64 & 0xf;
                              if ((char)uVar64 != '\0') {
                                p_Var7 = context->args->filter;
                                if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var7)((RTCFilterFunctionNArguments *)&p1);
                                  auVar71 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar173 = ZEXT1664(auVar71);
                                  auVar66 = vxorps_avx512vl(auVar66,auVar66);
                                  auVar172 = ZEXT1664(auVar66);
                                  auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                  auVar171 = ZEXT1664(auVar66);
                                  auVar66 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                  auVar170 = ZEXT1664(auVar66);
                                  auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar169 = ZEXT1664(auVar66);
                                  auVar66 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar168 = ZEXT1664(auVar66);
                                }
                                uVar64 = vptestmd_avx512vl((undefined1  [16])itime.field_0,
                                                           (undefined1  [16])itime.field_0);
                                uVar64 = uVar64 & 0xf;
                                auVar66 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                bVar63 = (bool)((byte)uVar64 & 1);
                                auVar85._0_4_ =
                                     (uint)bVar63 * auVar66._0_4_ |
                                     (uint)!bVar63 * *(int *)(p1.field_0._24_8_ + 0x80);
                                bVar63 = (bool)((byte)(uVar64 >> 1) & 1);
                                auVar85._4_4_ =
                                     (uint)bVar63 * auVar66._4_4_ |
                                     (uint)!bVar63 * *(int *)(p1.field_0._24_8_ + 0x84);
                                bVar63 = (bool)((byte)(uVar64 >> 2) & 1);
                                auVar85._8_4_ =
                                     (uint)bVar63 * auVar66._8_4_ |
                                     (uint)!bVar63 * *(int *)(p1.field_0._24_8_ + 0x88);
                                bVar63 = SUB81(uVar64 >> 3,0);
                                auVar85._12_4_ =
                                     (uint)bVar63 * auVar66._12_4_ |
                                     (uint)!bVar63 * *(int *)(p1.field_0._24_8_ + 0x8c);
                                *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar85;
                              }
                              bVar51 = (byte)uVar64;
                              auVar86._0_4_ =
                                   (uint)(bVar51 & 1) * *(int *)pRVar1 |
                                   (uint)!(bool)(bVar51 & 1) * iVar48;
                              bVar63 = (bool)((byte)(uVar64 >> 1) & 1);
                              auVar86._4_4_ =
                                   (uint)bVar63 * *(int *)(ray + 0x84) | (uint)!bVar63 * iVar41;
                              bVar63 = (bool)((byte)(uVar64 >> 2) & 1);
                              auVar86._8_4_ =
                                   (uint)bVar63 * *(int *)(ray + 0x88) | (uint)!bVar63 * iVar42;
                              bVar63 = SUB81(uVar64 >> 3,0);
                              auVar86._12_4_ =
                                   (uint)bVar63 * *(int *)(ray + 0x8c) | (uint)!bVar63 * iVar43;
                              *(undefined1 (*) [16])pRVar1 = auVar86;
                            }
                            bVar46 = (bVar51 ^ 0xf) & bVar46;
                          }
                          if ((bVar46 == 0) || (bVar63 = 2 < uVar55, uVar55 = uVar55 + 1, bVar63))
                          break;
                        }
                        bVar50 = bVar50 & bVar46;
                      } while ((bVar50 != 0) && (uVar49 = uVar49 + 1, uVar49 < uVar65 - 8));
                      bVar50 = bVar50 ^ 0xf;
                    }
                    bVar50 = (byte)uVar52 | bVar50;
                    uVar52 = (ushort)bVar50;
                    if (bVar50 == 0xf) goto LAB_00737e8a;
                    auVar66 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    tray.tfar.field_0.i[0] =
                         (uint)(bVar50 & 1) * auVar66._0_4_ |
                         (uint)!(bool)(bVar50 & 1) * tray.tfar.field_0.i[0];
                    bVar63 = (bool)(bVar50 >> 1 & 1);
                    tray.tfar.field_0.i[1] =
                         (uint)bVar63 * auVar66._4_4_ | (uint)!bVar63 * tray.tfar.field_0.i[1];
                    bVar63 = (bool)(bVar50 >> 2 & 1);
                    tray.tfar.field_0.i[2] =
                         (uint)bVar63 * auVar66._8_4_ | (uint)!bVar63 * tray.tfar.field_0.i[2];
                    bVar63 = (bool)(bVar50 >> 3 & 1);
                    tray.tfar.field_0.i[3] =
                         (uint)bVar63 * auVar66._12_4_ | (uint)!bVar63 * tray.tfar.field_0.i[3];
                    iVar48 = 0;
                    break;
                  }
                  goto LAB_00737ebf;
                }
                uVar11 = vcmpps_avx512vl(auVar163._0_16_,(undefined1  [16])tray.tfar.field_0,9);
                uVar49 = root.ptr & 0xfffffffffffffff0;
                auVar163 = ZEXT1664(auVar171._0_16_);
                uVar65 = 0;
                root.ptr = 8;
                do {
                  sVar3 = *(size_t *)(uVar49 + uVar65 * 8);
                  if (sVar3 != 8) {
                    uVar62 = *(undefined4 *)(uVar49 + 0x80 + uVar65 * 4);
                    auVar99._4_4_ = uVar62;
                    auVar99._0_4_ = uVar62;
                    auVar99._8_4_ = uVar62;
                    auVar99._12_4_ = uVar62;
                    auVar66 = *(undefined1 (*) [16])(ray + 0x70);
                    uVar62 = *(undefined4 *)(uVar49 + 0x20 + uVar65 * 4);
                    auVar16._4_4_ = uVar62;
                    auVar16._0_4_ = uVar62;
                    auVar16._8_4_ = uVar62;
                    auVar16._12_4_ = uVar62;
                    auVar71 = vfmadd213ps_avx512vl(auVar99,auVar66,auVar16);
                    uVar62 = *(undefined4 *)(uVar49 + 0xa0 + uVar65 * 4);
                    auVar104._4_4_ = uVar62;
                    auVar104._0_4_ = uVar62;
                    auVar104._8_4_ = uVar62;
                    auVar104._12_4_ = uVar62;
                    uVar62 = *(undefined4 *)(uVar49 + 0x40 + uVar65 * 4);
                    auVar17._4_4_ = uVar62;
                    auVar17._0_4_ = uVar62;
                    auVar17._8_4_ = uVar62;
                    auVar17._12_4_ = uVar62;
                    auVar67 = vfmadd213ps_avx512vl(auVar104,auVar66,auVar17);
                    uVar62 = *(undefined4 *)(uVar49 + 0xc0 + uVar65 * 4);
                    auVar110._4_4_ = uVar62;
                    auVar110._0_4_ = uVar62;
                    auVar110._8_4_ = uVar62;
                    auVar110._12_4_ = uVar62;
                    uVar62 = *(undefined4 *)(uVar49 + 0x60 + uVar65 * 4);
                    auVar18._4_4_ = uVar62;
                    auVar18._0_4_ = uVar62;
                    auVar18._8_4_ = uVar62;
                    auVar18._12_4_ = uVar62;
                    auVar70 = vfmadd213ps_avx512vl(auVar110,auVar66,auVar18);
                    uVar62 = *(undefined4 *)(uVar49 + 0x90 + uVar65 * 4);
                    auVar116._4_4_ = uVar62;
                    auVar116._0_4_ = uVar62;
                    auVar116._8_4_ = uVar62;
                    auVar116._12_4_ = uVar62;
                    uVar62 = *(undefined4 *)(uVar49 + 0x30 + uVar65 * 4);
                    auVar19._4_4_ = uVar62;
                    auVar19._0_4_ = uVar62;
                    auVar19._8_4_ = uVar62;
                    auVar19._12_4_ = uVar62;
                    auVar72 = vfmadd213ps_avx512vl(auVar116,auVar66,auVar19);
                    uVar62 = *(undefined4 *)(uVar49 + 0xb0 + uVar65 * 4);
                    auVar122._4_4_ = uVar62;
                    auVar122._0_4_ = uVar62;
                    auVar122._8_4_ = uVar62;
                    auVar122._12_4_ = uVar62;
                    uVar62 = *(undefined4 *)(uVar49 + 0x50 + uVar65 * 4);
                    auVar20._4_4_ = uVar62;
                    auVar20._0_4_ = uVar62;
                    auVar20._8_4_ = uVar62;
                    auVar20._12_4_ = uVar62;
                    auVar73 = vfmadd213ps_avx512vl(auVar122,auVar66,auVar20);
                    uVar62 = *(undefined4 *)(uVar49 + 0xd0 + uVar65 * 4);
                    auVar128._4_4_ = uVar62;
                    auVar128._0_4_ = uVar62;
                    auVar128._8_4_ = uVar62;
                    auVar128._12_4_ = uVar62;
                    uVar62 = *(undefined4 *)(uVar49 + 0x70 + uVar65 * 4);
                    auVar21._4_4_ = uVar62;
                    auVar21._0_4_ = uVar62;
                    auVar21._8_4_ = uVar62;
                    auVar21._12_4_ = uVar62;
                    auVar74 = vfmadd213ps_avx512vl(auVar128,auVar66,auVar21);
                    auVar44._4_4_ = tray.org_rdir.field_0._4_4_;
                    auVar44._0_4_ = tray.org_rdir.field_0._0_4_;
                    auVar44._8_4_ = tray.org_rdir.field_0._8_4_;
                    auVar44._12_4_ = tray.org_rdir.field_0._12_4_;
                    auVar45._4_4_ = tray.org_rdir.field_0._20_4_;
                    auVar45._0_4_ = tray.org_rdir.field_0._16_4_;
                    auVar45._8_4_ = tray.org_rdir.field_0._24_4_;
                    auVar45._12_4_ = tray.org_rdir.field_0._28_4_;
                    auVar68 = vfmsub213ps_fma(auVar71,(undefined1  [16])
                                                      tray.rdir.field_0.field_0.x.field_0,auVar44);
                    auVar69 = vfmsub213ps_fma(auVar67,(undefined1  [16])
                                                      tray.rdir.field_0.field_0.y.field_0,auVar45);
                    auVar70 = vfmsub213ps_fma(auVar70,(undefined1  [16])
                                                      tray.rdir.field_0.field_0.z.field_0,
                                              (undefined1  [16])
                                              tray.org_rdir.field_0.field_0.z.field_0);
                    auVar72 = vfmsub213ps_fma(auVar72,(undefined1  [16])
                                                      tray.rdir.field_0.field_0.x.field_0,auVar44);
                    auVar73 = vfmsub213ps_fma(auVar73,(undefined1  [16])
                                                      tray.rdir.field_0.field_0.y.field_0,auVar45);
                    auVar74 = vfmsub213ps_fma(auVar74,(undefined1  [16])
                                                      tray.rdir.field_0.field_0.z.field_0,
                                              (undefined1  [16])
                                              tray.org_rdir.field_0.field_0.z.field_0);
                    auVar71 = vpminsd_avx(auVar68,auVar72);
                    auVar67 = vpminsd_avx(auVar69,auVar73);
                    auVar71 = vpmaxsd_avx(auVar71,auVar67);
                    auVar67 = vpminsd_avx(auVar70,auVar74);
                    auVar71 = vpmaxsd_avx(auVar71,auVar67);
                    auVar67 = vpmaxsd_avx(auVar68,auVar72);
                    auVar68 = vpmaxsd_avx(auVar69,auVar73);
                    auVar68 = vpminsd_avx(auVar67,auVar68);
                    auVar67 = vpmaxsd_avx(auVar70,auVar74);
                    auVar68 = vpminsd_avx(auVar68,auVar67);
                    auVar67 = vpmaxsd_avx(auVar71,(undefined1  [16])tray.tnear.field_0);
                    auVar68 = vpminsd_avx(auVar68,(undefined1  [16])tray.tfar.field_0);
                    uVar12 = vcmpps_avx512vl(auVar67,auVar68,2);
                    bVar50 = (byte)uVar12;
                    if ((uVar148 & 7) == 6) {
                      uVar62 = *(undefined4 *)(uVar49 + 0xf0 + uVar65 * 4);
                      auVar22._4_4_ = uVar62;
                      auVar22._0_4_ = uVar62;
                      auVar22._8_4_ = uVar62;
                      auVar22._12_4_ = uVar62;
                      uVar12 = vcmpps_avx512vl(auVar66,auVar22,1);
                      uVar62 = *(undefined4 *)(uVar49 + 0xe0 + uVar65 * 4);
                      auVar23._4_4_ = uVar62;
                      auVar23._0_4_ = uVar62;
                      auVar23._8_4_ = uVar62;
                      auVar23._12_4_ = uVar62;
                      uVar13 = vcmpps_avx512vl(auVar66,auVar23,0xd);
                      bVar50 = (byte)uVar12 & (byte)uVar13 & bVar50;
                    }
                    bVar50 = bVar50 & (byte)uVar11;
                    if (bVar50 != 0) {
                      auVar71 = vblendmps_avx512vl(auVar171._0_16_,auVar71);
                      bVar63 = (bool)(bVar50 >> 1 & 1);
                      bVar8 = (bool)(bVar50 >> 2 & 1);
                      bVar9 = (bool)(bVar50 >> 3 & 1);
                      if (root.ptr != 8) {
                        pNVar60->ptr = root.ptr;
                        pNVar60 = pNVar60 + 1;
                        *paVar61 = auVar163._0_16_;
                        paVar61 = paVar61 + 1;
                      }
                      auVar163 = ZEXT1664(CONCAT412((uint)bVar9 * auVar71._12_4_ |
                                                    (uint)!bVar9 * auVar66._12_4_,
                                                    CONCAT48((uint)bVar8 * auVar71._8_4_ |
                                                             (uint)!bVar8 * auVar66._8_4_,
                                                             CONCAT44((uint)bVar63 * auVar71._4_4_ |
                                                                      (uint)!bVar63 * auVar66._4_4_,
                                                                      (uint)(bVar50 & 1) *
                                                                      auVar71._0_4_ |
                                                                      (uint)!(bool)(bVar50 & 1) *
                                                                      auVar66._0_4_))));
                      root.ptr = sVar3;
                    }
                  }
                } while ((sVar3 != 8) && (bVar63 = uVar65 < 3, uVar65 = uVar65 + 1, bVar63));
                iVar48 = 0;
                if (root.ptr == 8) {
LAB_0073750d:
                  bVar63 = false;
                  iVar48 = 4;
                }
                else {
                  uVar11 = vcmpps_avx512vl((undefined1  [16])auVar163._0_16_,
                                           (undefined1  [16])tray.tfar.field_0,9);
                  bVar63 = true;
                  if ((uint)POPCOUNT((int)uVar11) <= uVar58) {
                    pNVar60->ptr = root.ptr;
                    pNVar60 = pNVar60 + 1;
                    *paVar61 = auVar163._0_16_;
                    paVar61 = paVar61 + 1;
                    goto LAB_0073750d;
                  }
                }
              } while (bVar63);
            }
          }
        }
      } while (iVar48 != 3);
      bVar47 = (byte)uVar52 & bVar47;
      bVar63 = (bool)(bVar47 >> 1 & 1);
      bVar8 = (bool)(bVar47 >> 2 & 1);
      *(uint *)pRVar1 =
           (uint)(bVar47 & 1) * auVar170._0_4_ | (uint)!(bool)(bVar47 & 1) * *(int *)pRVar1;
      *(uint *)(ray + 0x84) = (uint)bVar63 * auVar170._4_4_ | (uint)!bVar63 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar8 * auVar170._8_4_ | (uint)!bVar8 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar47 >> 3) * auVar170._12_4_ | (uint)!(bool)(bVar47 >> 3) * *(int *)(ray + 0x8c)
      ;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }